

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fare_attributes.c
# Opt level: O0

payment_method_t parse_payment_method(char *value)

{
  int iVar1;
  char *value_local;
  
  iVar1 = strcmp(value,"0");
  if (iVar1 == 0) {
    value_local._4_4_ = PM_ON_BOARD;
  }
  else {
    iVar1 = strcmp(value,"1");
    if (iVar1 == 0) {
      value_local._4_4_ = PM_BEFOREHAND;
    }
    else {
      value_local._4_4_ = PM_NOT_SET;
    }
  }
  return value_local._4_4_;
}

Assistant:

payment_method_t parse_payment_method(const char *value) {
    if (strcmp(value, "0") == 0)
        return PM_ON_BOARD;
    else if (strcmp(value, "1") == 0)
        return PM_BEFOREHAND;
    else
        return PM_NOT_SET;
}